

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  ushort uVar1;
  StkId pTVar2;
  long lVar3;
  GCObject *pGVar4;
  ulong uVar5;
  int iVar6;
  CallInfo *pCVar7;
  uint uVar8;
  long lVar9;
  LuaType *pLVar10;
  ulong uVar11;
  uint uVar12;
  TValue *pTVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  
  if (L->magic != '*') {
    __assert_fail("L->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18a,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  if (ci->magic != '*') {
    __assert_fail("ci->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18b,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  uVar1 = ci->nresults;
  uVar12 = (uint)(short)uVar1;
  if ((L->hookmask & 6) == 0) {
    pCVar7 = ci->previous;
    pTVar13 = firstResult;
  }
  else {
    if ((L->hookmask & 2) != 0) {
      pTVar2 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar2) + (long)L->stack);
    }
    pCVar7 = ci->previous;
    L->oldpc = (pCVar7->u).l.savedpc;
    pTVar13 = firstResult;
  }
  pTVar2 = ci->func;
  L->ci = pCVar7;
  uVar8 = (uint)uVar1;
  iVar6 = 1;
  if (uVar1 != 0) {
    if (uVar8 == 1) {
      if (nres == 0) {
        pTVar13 = &luaO_nilobject_;
      }
      pGVar4 = (pTVar13->value_).gc;
      (pTVar2->value_).gc = pGVar4;
      uVar1 = pTVar13->tt_;
      pTVar2->tt_ = uVar1;
      uVar8 = 1;
      if ((short)uVar1 < 0) {
        if (((uVar1 & 0x7f) != (ushort)pGVar4->tt) ||
           (iVar6 = 1, (pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x165,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
        }
      }
      else {
        iVar6 = 1;
      }
    }
    else if (uVar8 == 0xffff) {
      if (0 < nres) {
        lVar9 = 0;
        do {
          lVar3 = *(long *)((long)&pTVar13->value_ + lVar9);
          *(long *)((long)&pTVar2->value_ + lVar9) = lVar3;
          uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar9);
          *(ushort *)((long)&pTVar2->tt_ + lVar9) = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
              ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x16b,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
          }
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(uint)nres << 4 != lVar9);
      }
      iVar6 = 0;
      uVar8 = nres;
    }
    else {
      uVar8 = uVar12;
      if (nres < (int)uVar12) {
        if (nres < 1) {
          nres = 0;
        }
        else {
          lVar9 = 0;
          do {
            lVar3 = *(long *)((long)&pTVar13->value_ + lVar9);
            *(long *)((long)&pTVar2->value_ + lVar9) = lVar3;
            uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar9);
            *(ushort *)((long)&pTVar2->tt_ + lVar9) = uVar1;
            if (((short)uVar1 < 0) &&
               (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
                ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x177,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
            }
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(uint)nres << 4 != lVar9);
        }
        if (nres < (int)uVar12) {
          auVar14 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar15 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pLVar10 = &pTVar2[(ulong)(uint)nres + 0x1f].tt_;
          auVar18 = vpbroadcastq_avx512f();
          uVar11 = 0;
          do {
            auVar19 = vpbroadcastq_avx512f();
            auVar20 = vporq_avx512f(auVar19,auVar17);
            uVar5 = vpcmpuq_avx512f(auVar20,auVar18,2);
            if ((uVar5 & 1) != 0) {
              pLVar10[-0xf8] = 0;
            }
            if ((uVar5 & 2) != 0) {
              pLVar10[-0xf0] = 0;
            }
            if ((uVar5 & 4) != 0) {
              pLVar10[-0xe8] = 0;
            }
            if ((uVar5 & 8) != 0) {
              pLVar10[-0xe0] = 0;
            }
            if ((uVar5 & 0x10) != 0) {
              pLVar10[-0xd8] = 0;
            }
            if ((uVar5 & 0x20) != 0) {
              pLVar10[-0xd0] = 0;
            }
            if ((uVar5 & 0x40) != 0) {
              pLVar10[-200] = 0;
            }
            if ((uVar5 & 0x80) != 0) {
              pLVar10[-0xc0] = 0;
            }
            auVar20 = vporq_avx512f(auVar19,auVar16);
            uVar5 = vpcmpuq_avx512f(auVar20,auVar18,2);
            if ((uVar5 & 1) != 0) {
              pLVar10[-0xb8] = 0;
            }
            if ((uVar5 & 2) != 0) {
              pLVar10[-0xb0] = 0;
            }
            if ((uVar5 & 4) != 0) {
              pLVar10[-0xa8] = 0;
            }
            if ((uVar5 & 8) != 0) {
              pLVar10[-0xa0] = 0;
            }
            if ((uVar5 & 0x10) != 0) {
              pLVar10[-0x98] = 0;
            }
            if ((uVar5 & 0x20) != 0) {
              pLVar10[-0x90] = 0;
            }
            if ((uVar5 & 0x40) != 0) {
              pLVar10[-0x88] = 0;
            }
            if ((uVar5 & 0x80) != 0) {
              pLVar10[-0x80] = 0;
            }
            auVar20 = vporq_avx512f(auVar19,auVar15);
            uVar5 = vpcmpuq_avx512f(auVar20,auVar18,2);
            if ((uVar5 & 1) != 0) {
              pLVar10[-0x78] = 0;
            }
            if ((uVar5 & 2) != 0) {
              pLVar10[-0x70] = 0;
            }
            if ((uVar5 & 4) != 0) {
              pLVar10[-0x68] = 0;
            }
            if ((uVar5 & 8) != 0) {
              pLVar10[-0x60] = 0;
            }
            if ((uVar5 & 0x10) != 0) {
              pLVar10[-0x58] = 0;
            }
            if ((uVar5 & 0x20) != 0) {
              pLVar10[-0x50] = 0;
            }
            if ((uVar5 & 0x40) != 0) {
              pLVar10[-0x48] = 0;
            }
            if ((uVar5 & 0x80) != 0) {
              pLVar10[-0x40] = 0;
            }
            auVar19 = vporq_avx512f(auVar19,auVar14);
            uVar5 = vpcmpuq_avx512f(auVar19,auVar18,2);
            if ((uVar5 & 1) != 0) {
              pLVar10[-0x38] = 0;
            }
            if ((uVar5 & 2) != 0) {
              pLVar10[-0x30] = 0;
            }
            if ((uVar5 & 4) != 0) {
              pLVar10[-0x28] = 0;
            }
            if ((uVar5 & 8) != 0) {
              pLVar10[-0x20] = 0;
            }
            if ((uVar5 & 0x10) != 0) {
              pLVar10[-0x18] = 0;
            }
            if ((uVar5 & 0x20) != 0) {
              pLVar10[-0x10] = 0;
            }
            if ((uVar5 & 0x40) != 0) {
              pLVar10[-8] = 0;
            }
            if ((uVar5 & 0x80) != 0) {
              *pLVar10 = 0;
            }
            uVar11 = uVar11 + 0x20;
            pLVar10 = pLVar10 + 0x100;
          } while ((((ulong)uVar12 - (ulong)(uint)nres) + 0x1f & 0xffffffffffffffe0) != uVar11);
        }
      }
      else if (0 < (short)uVar1) {
        lVar9 = 0;
        do {
          lVar3 = *(long *)((long)&pTVar13->value_ + lVar9);
          *(long *)((long)&pTVar2->value_ + lVar9) = lVar3;
          uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar9);
          *(ushort *)((long)&pTVar2->tt_ + lVar9) = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
              ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x173,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
          }
          lVar9 = lVar9 + 0x10;
        } while ((ulong)uVar12 << 4 != lVar9);
      }
    }
  }
  L->top = pTVar2 + (int)uVar8;
  return iVar6;
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  lua_assert(L->magic == 42);
  lua_assert(ci->magic == 42);
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}